

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_search.hpp
# Opt level: O2

int * burst::detail::
      galloping_search<int_const*,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>
                (int *first,int *last,int *value)

{
  bool bVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  anon_class_16_2_ce2e793d __pred;
  not_fn_t<burst::invert_t<std::less<void>_>_> local_19;
  
  __pred.compare = &local_19;
  __pred.value = value;
  bVar1 = std::
          is_partitioned<int_const*,burst::detail::galloping_search<int_const*,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>(int_const*,int_const*,int_const&,burst::not_fn_t<burst::invert_t<std::less<void>>>)::_lambda(auto:1_const&)_1_>
                    (first,last,__pred);
  if (bVar1) {
    lVar2 = (long)last - (long)first;
    lVar4 = 1;
    lVar5 = 0;
    while ((piVar3 = last, lVar5 + lVar4 < lVar2 >> 2 && (piVar3 = first + lVar4, *piVar3 <= *value)
           )) {
      lVar5 = lVar5 + lVar4 + 1;
      lVar4 = lVar4 * 2;
      first = piVar3 + 1;
    }
    piVar3 = std::
             __lower_bound<int_const*,int,__gnu_cxx::__ops::_Iter_comp_val<burst::not_fn_t<burst::invert_t<std::less<void>>>>>
                       (first,piVar3,value);
    return piVar3;
  }
  __assert_fail("std::is_partitioned(first, last, [& value, & compare] (const auto & e) {return compare(e, value);})"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/detail/galloping_search.hpp"
                ,0x16,
                "RandomAccessIterator burst::detail::galloping_search(RandomAccessIterator, RandomAccessIterator, const Value &, Compare) [RandomAccessIterator = const int *, Value = int, Compare = burst::not_fn_t<burst::invert_t<std::less<void>>>]"
               );
}

Assistant:

RandomAccessIterator
            galloping_search
            (
                RandomAccessIterator first, RandomAccessIterator last,
                const Value & value,
                Compare compare
            )
        {
            assert(std::is_partitioned(first, last,
                [& value, & compare] (const auto & e) {return compare(e, value);}));

            const auto distance = std::distance(first, last);

            auto position = static_cast<decltype(distance)>(0);
            auto step = static_cast<decltype(distance)>(1);

            while (position + step < distance)
            {
                const auto current = std::next(first, step);
                if (compare(*current, value))
                {
                    first = std::next(current);
                    position += step + 1;
                    step *= 2;
                }
                else
                {
                    return std::lower_bound(first, current, value, compare);
                }
            }

            return std::lower_bound(first, last, value, compare);
        }